

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.hpp
# Opt level: O3

bool __thiscall
tcb::unicode::detail::
unicode_view<std::istreambuf_iterator<char16_t,_std::char_traits<char16_t>_>,_std::istreambuf_iterator<char16_t,_std::char_traits<char16_t>_>,_char16_t,_char>
::iterator::operator==(iterator *this,iterator *other)

{
  bool bVar1;
  int_type iVar2;
  int_type iVar3;
  int iVar4;
  
  bVar1 = done(this);
  if ((bVar1) && (bVar1 = done(other), bVar1)) {
    return true;
  }
  iVar2 = std::istreambuf_iterator<char16_t,_std::char_traits<char16_t>_>::_M_get(&this->first_);
  iVar3 = std::istreambuf_iterator<char16_t,_std::char_traits<char16_t>_>::_M_get(&other->first_);
  if ((iVar2 == 0xffff) != (iVar3 != 0xffff)) {
    iVar2 = std::istreambuf_iterator<char16_t,_std::char_traits<char16_t>_>::_M_get(&this->last_);
    iVar3 = std::istreambuf_iterator<char16_t,_std::char_traits<char16_t>_>::_M_get(&other->last_);
    if (((iVar2 == 0xffff) != (iVar3 != 0xffff)) && (this->idx_ == other->idx_)) {
      iVar4 = (this->next_chars_).size_;
      if (iVar4 == (other->next_chars_).size_) {
        if (iVar4 != 0) {
          iVar4 = bcmp(this,other,(long)iVar4);
          return iVar4 == 0;
        }
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool operator==(const iterator& other) const
        {
            return (done() && other.done()) ||
                    (first_ == other.first_ &&
                    last_ == other.last_ &&
                    idx_ == other.idx_ &&
                    next_chars_ == other.next_chars_);
        }